

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O1

int rs_read_coord(FILE *inf,coord *c)

{
  uint uVar1;
  ulong in_RAX;
  coord in;
  undefined8 local_18;
  
  if ((read_error == 0) && ((format_error & 1) == 0)) {
    local_18 = in_RAX;
    rs_read_int(inf,(int *)&local_18);
    uVar1 = rs_read_int(inf,(int *)((long)&local_18 + 4));
    in_RAX = (ulong)uVar1;
    if ((format_error == 0) && ((read_error & 1) == 0)) {
      c->x = (int)local_18;
      in_RAX = (ulong)local_18._4_4_;
      c->y = local_18._4_4_;
    }
  }
  return (int)in_RAX;
}

Assistant:

static int rs_read_coord(FILE *inf, coord *c)
{
    coord in;

    if (read_error || format_error)
        return(READSTAT);

    rs_read_int(inf,&in.x);
    rs_read_int(inf,&in.y);

    if (READSTAT == 0) 
    {
        c->x = in.x;
        c->y = in.y;
    }

    return(READSTAT);
}